

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

uint64_t capnp::compiler::generateRandomId(void)

{
  int iVar1;
  ssize_t sVar2;
  OwnFd fd;
  Fault f_2;
  Fault f;
  ssize_t n;
  uint64_t result;
  
  do {
    fd.fd = open("/dev/urandom",0);
    if (-1 < fd.fd) goto LAB_001305fd;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x3d,iVar1,"_kj_fd = open(\"/dev/urandom\", 00)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_001305fd:
  do {
    sVar2 = read(fd.fd,&result,8);
    n = sVar2;
    if (-1 < sVar2) goto LAB_0013063a;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault<int,char_const(&)[13]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
               ,0x40,iVar1,"n = read(fd, &result, sizeof(result))","\"/dev/urandom\"",
               (char (*) [13])"/dev/urandom");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_0013063a:
  f.exception = (Exception *)&n;
  if (sVar2 == 8) {
    kj::OwnFd::~OwnFd(&fd);
    return result | 0x8000000000000000;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long>&,char_const(&)[35],long&>
            (&f_2,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/parser.c++"
             ,0x41,FAILED,"n == sizeof(result)",
             "_kjCondition,\"Incomplete read from /dev/urandom.\", n",
             (DebugComparison<long_&,_unsigned_long> *)&f,
             (char (*) [35])"Incomplete read from /dev/urandom.",(long *)f.exception);
  kj::_::Debug::Fault::fatal(&f_2);
}

Assistant:

uint64_t generateRandomId() {
  uint64_t result;

#if _WIN32
  HCRYPTPROV handle;
  KJ_ASSERT(CryptAcquireContextW(&handle, nullptr, nullptr,
                                 PROV_RSA_FULL, CRYPT_VERIFYCONTEXT | CRYPT_SILENT));
  KJ_DEFER(KJ_ASSERT(CryptReleaseContext(handle, 0)) {break;});

  KJ_ASSERT(CryptGenRandom(handle, sizeof(result), reinterpret_cast<BYTE*>(&result)));

#else
  auto fd = KJ_SYSCALL_FD(open("/dev/urandom", O_RDONLY));

  ssize_t n;
  KJ_SYSCALL(n = read(fd, &result, sizeof(result)), "/dev/urandom");
  KJ_ASSERT(n == sizeof(result), "Incomplete read from /dev/urandom.", n);
#endif

  return result | (1ull << 63);
}